

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void google::protobuf::anon_unknown_9::ByteSizeConsistencyError
               (int byte_size_before_serialization,int byte_size_after_serialization,
               int bytes_produced_by_serialization)

{
  LogMessage *pLVar1;
  LogFinisher local_e1;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  int local_10;
  int bytes_produced_by_serialization_local;
  int byte_size_after_serialization_local;
  int byte_size_before_serialization_local;
  
  local_51 = 0;
  local_14 = bytes_produced_by_serialization;
  local_10 = byte_size_after_serialization;
  bytes_produced_by_serialization_local = byte_size_before_serialization;
  if (byte_size_before_serialization != byte_size_after_serialization) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x3f);
    local_51 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"Protocol message was modified concurrently during serialization.");
    internal::LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (local_14 != bytes_produced_by_serialization_local) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x41);
    local_a1 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of the message."
                       );
    internal::LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  internal::LogMessage::LogMessage
            (&local_e0,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x45);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_e0,"This shouldn\'t be called if all the sizes are equal.");
  internal::LogFinisher::operator=(&local_e1,pLVar1);
  internal::LogMessage::~LogMessage(&local_e0);
  return;
}

Assistant:

void ByteSizeConsistencyError(int byte_size_before_serialization,
                              int byte_size_after_serialization,
                              int bytes_produced_by_serialization) {
  GOOGLE_CHECK_EQ(byte_size_before_serialization, byte_size_after_serialization)
      << "Protocol message was modified concurrently during serialization.";
  GOOGLE_CHECK_EQ(bytes_produced_by_serialization, byte_size_before_serialization)
      << "Byte size calculation and serialization were inconsistent.  This "
         "may indicate a bug in protocol buffers or it may be caused by "
         "concurrent modification of the message.";
  GOOGLE_LOG(FATAL) << "This shouldn't be called if all the sizes are equal.";
}